

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O0

void SGP4::RecomputeConstants
               (double xinc,double *sinio,double *cosio,double *x3thm1,double *x1mth2,double *x7thm1
               ,double *xlcof,double *aycof)

{
  double dVar1;
  double theta2;
  double *xlcof_local;
  double *x7thm1_local;
  double *x1mth2_local;
  double *x3thm1_local;
  double *cosio_local;
  double *sinio_local;
  double xinc_local;
  
  dVar1 = sin(xinc);
  *sinio = dVar1;
  dVar1 = cos(xinc);
  *cosio = dVar1;
  dVar1 = *cosio * *cosio;
  *x3thm1 = dVar1 * 3.0 + -1.0;
  *x1mth2 = 1.0 - dVar1;
  *x7thm1 = dVar1 * 7.0 + -1.0;
  if (ABS(*cosio + 1.0) <= 1.5e-12) {
    *xlcof = (*sinio * 0.000586267430002882 * (*cosio * 5.0 + 3.0)) / 1.5e-12;
  }
  else {
    *xlcof = (*sinio * 0.000586267430002882 * (*cosio * 5.0 + 3.0)) / (*cosio + 1.0);
  }
  *aycof = *sinio * 0.001172534860005764;
  return;
}

Assistant:

void SGP4::RecomputeConstants(const double xinc,
                              double& sinio,
                              double& cosio,
                              double& x3thm1,
                              double& x1mth2,
                              double& x7thm1,
                              double& xlcof,
                              double& aycof)
{
    sinio = sin(xinc);
    cosio = cos(xinc);

    const double theta2 = cosio * cosio;

    x3thm1 = 3.0 * theta2 - 1.0;
    x1mth2 = 1.0 - theta2;
    x7thm1 = 7.0 * theta2 - 1.0;

    if (fabs(cosio + 1.0) > 1.5e-12)
    {
        xlcof = 0.125 * kA3OVK2 * sinio * (3.0 + 5.0 * cosio) / (1.0 + cosio);
    }
    else
    {
        xlcof = 0.125 * kA3OVK2 * sinio * (3.0 + 5.0 * cosio) / 1.5e-12;
    }

    aycof = 0.25 * kA3OVK2 * sinio;
}